

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_a31d20::MemPoolAccept::ConsensusScriptChecks
          (MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  uint uVar2;
  element_type *this_00;
  CTransaction *tx_00;
  CCoinsViewCache *pCVar3;
  ValidationCache *this_01;
  bool *pbVar4;
  TxValidationState *state_00;
  char *flag;
  ConstevalFormatString<2U> in_RDX;
  size_t in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000088;
  uint currentBlockScriptVerifyFlags;
  TxValidationState *state;
  uint256 *hash;
  CTransaction *tx;
  MemPoolAccept *in_stack_fffffffffffffec8;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  char *in_stack_fffffffffffffed0;
  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffed8;
  int line;
  ChainstateManager *in_stack_fffffffffffffee0;
  char *file;
  Chainstate *in_stack_fffffffffffffee8;
  int source_line;
  PrecomputedTransactionData *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff4c;
  CTxMemPool *in_stack_ffffffffffffff50;
  char *func;
  undefined4 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffff98;
  CCoinsViewCache *in_stack_ffffffffffffffb0;
  ValidationCache *in_stack_ffffffffffffffb8;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x7f8b0c);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x7f8b30);
  this_00 = std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(in_stack_fffffffffffffed8);
  tx_00 = (CTransaction *)
          transaction_identifier::operator_cast_to_uint256_
                    ((transaction_identifier<false> *)in_stack_fffffffffffffec8);
  state_00 = (TxValidationState *)(in_RDX.fmt + 0xd0);
  CChain::Tip((CChain *)in_stack_fffffffffffffed8);
  uVar2 = GetBlockScriptFlags((CBlockIndex *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  flag = in_RDX.fmt + 0x118;
  pCVar3 = Chainstate::CoinsTip(in_stack_fffffffffffffee8);
  iVar5 = (int)((ulong)pCVar3 >> 0x20);
  this_01 = GetValidationCache(in_stack_fffffffffffffec8);
  source_line = iVar5;
  bVar1 = CheckInputsFromMempoolAndCache
                    (tx_00,state_00,(CCoinsViewCache *)CONCAT44(uVar2,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee8,
               (char *)in_stack_fffffffffffffee0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee8,
               (char *)in_stack_fffffffffffffee0);
    func = 
    "BUG! PLEASE REPORT THIS! CheckInputScripts failed against latest-block but not STANDARD flags %s, %s\n"
    ;
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)this_01);
    ValidationState<TxValidationResult>::ToString_abi_cxx11_
              ((ValidationState<TxValidationResult> *)this_00);
    file = &stack0xffffffffffffffb8;
    line = (int)((ulong)local_28 >> 0x20);
    this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(iVar5,2)
    ;
    logging_function._M_len._6_1_ = in_stack_ffffffffffffff96;
    logging_function._M_len._0_6_ = in_stack_ffffffffffffff90;
    logging_function._M_len._7_1_ = in_stack_ffffffffffffff97;
    logging_function._M_str = in_stack_ffffffffffffff98;
    source_file._M_str = in_RDI;
    source_file._M_len = in_RSI;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,source_line,(LogFlags)flag,in_stack_00000070,in_RDX,
               in_stack_00000080,in_stack_00000088);
    std::__cxx11::string::~string(this_02);
    std::__cxx11::string::~string(this_02);
    pbVar4 = inline_assertion_check<false,bool>
                       ((bool *)in_stack_fffffffffffffee8,file,line,func,(char *)this_02);
    bVar1 = (bool)(*pbVar4 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool MemPoolAccept::ConsensusScriptChecks(const ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransaction& tx = *ws.m_ptx;
    const uint256& hash = ws.m_hash;
    TxValidationState& state = ws.m_state;

    // Check again against the current block tip's script verification
    // flags to cache our script execution flags. This is, of course,
    // useless if the next block has different script flags from the
    // previous one, but because the cache tracks script flags for us it
    // will auto-invalidate and we'll just have a few blocks of extra
    // misses on soft-fork activation.
    //
    // This is also useful in case of bugs in the standard flags that cause
    // transactions to pass as valid when they're actually invalid. For
    // instance the STRICTENC flag was incorrectly allowing certain
    // CHECKSIG NOT scripts to pass, even though they were invalid.
    //
    // There is a similar check in CreateNewBlock() to prevent creating
    // invalid blocks (using TestBlockValidity), however allowing such
    // transactions into the mempool can be exploited as a DoS attack.
    unsigned int currentBlockScriptVerifyFlags{GetBlockScriptFlags(*m_active_chainstate.m_chain.Tip(), m_active_chainstate.m_chainman)};
    if (!CheckInputsFromMempoolAndCache(tx, state, m_view, m_pool, currentBlockScriptVerifyFlags,
                                        ws.m_precomputed_txdata, m_active_chainstate.CoinsTip(), GetValidationCache())) {
        LogPrintf("BUG! PLEASE REPORT THIS! CheckInputScripts failed against latest-block but not STANDARD flags %s, %s\n", hash.ToString(), state.ToString());
        return Assume(false);
    }

    return true;
}